

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::newline(JSPrinter *this)

{
  int local_14;
  int i;
  JSPrinter *this_local;
  
  if ((this->pretty & 1U) != 0) {
    emit(this,'\n');
    for (local_14 = 0; local_14 < this->indent; local_14 = local_14 + 1) {
      emit(this,' ');
    }
  }
  return;
}

Assistant:

void newline() {
    if (!pretty) {
      return;
    }
    emit('\n');
    for (int i = 0; i < indent; i++) {
      emit(' ');
    }
  }